

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
          (KeyMapBase<unsigned_int> *this,ViewType k,TreeIterator *it)

{
  map_index_t b;
  ulong *puVar1;
  NodeAndBucket NVar2;
  
  b = BucketNumber(this,k);
  puVar1 = (ulong *)(this->super_UntypedMapBase).table_[b];
  if (((ulong)puVar1 & 1) == 0 && puVar1 != (ulong *)0x0) {
    do {
      NVar2.bucket = b;
      NVar2.node = (NodeBase *)puVar1;
      NVar2._12_4_ = 0;
      if ((ViewType)puVar1[1] == k) {
        return NVar2;
      }
      puVar1 = (ulong *)*puVar1;
    } while (puVar1 != (ulong *)0x0);
  }
  else if (((ulong)puVar1 & 1) != 0) {
    NVar2 = UntypedMapBase::FindFromTree
                      (&this->super_UntypedMapBase,b,(VariantKey)(ZEXT416(k) << 0x40),it);
    return NVar2;
  }
  return (NodeAndBucket)(ZEXT416(b) << 0x40);
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }